

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::LoopEntryPointInfo::OnCleanup(LoopEntryPointInfo *this,bool isShutdown)

{
  bool bVar1;
  undefined7 in_register_00000031;
  
  bVar1 = EntryPointInfo::IsCodeGenDone(&this->super_EntryPointInfo);
  if ((bVar1) && (((this->super_EntryPointInfo).field_0x18 & 0x20) == 0)) {
    EntryPointInfo::CleanupNativeCode
              (&this->super_EntryPointInfo,
               (ScriptContext *)CONCAT71(in_register_00000031,isShutdown));
    return;
  }
  return;
}

Assistant:

void LoopEntryPointInfo::OnCleanup(bool isShutdown)
    {
#ifdef ASMJS_PLAT
        if (this->IsCodeGenDone() && !this->GetIsTJMode())
#else
        if (this->IsCodeGenDone())
#endif
        {
            JS_ETW(EtwTrace::LogLoopBodyUnloadEvent(this->loopHeader->functionBody, this,
                this->loopHeader->functionBody->GetLoopNumber(this->loopHeader)));

#if ENABLE_NATIVE_CODEGEN
            this->CleanupNativeCode(this->loopHeader->functionBody->GetScriptContext());
#endif
        }
    }